

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHarnessHandlers.cpp
# Opt level: O0

void __thiscall
XMLHarnessHandlers::XMLHarnessHandlers(XMLHarnessHandlers *this,XMLCh *baseURL,XMLCh *scanner)

{
  SAX2XMLReader *pSVar1;
  XMLURL *this_00;
  BaseErrorHandler *pBVar2;
  XMLCh *scanner_local;
  XMLCh *baseURL_local;
  XMLHarnessHandlers *this_local;
  
  BaseHarnessHandlers::BaseHarnessHandlers(&this->super_BaseHarnessHandlers,baseURL);
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_EntityResolver._vptr_EntityResolver =
       (_func_int **)&PTR__XMLHarnessHandlers_00118a00;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_DTDHandler._vptr_DTDHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00118b18;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_ContentHandler._vptr_ContentHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00118b50;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00118bc8;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_LexicalHandler._vptr_LexicalHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00118c08;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_DeclHandler._vptr_DeclHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00118c60;
  BaseErrorHandler::BaseErrorHandler(&this->fErrorHandler);
  xercesc_4_0::RefStackOf<xercesc_4_0::XMLURL>::RefStackOf
            (&this->fTestBaseURL,5,true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pSVar1 = (SAX2XMLReader *)
           xercesc_4_0::XMLReaderFactory::createXMLReader
                     (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)0x0);
  this->fParser = pSVar1;
  (*this->fParser->_vptr_SAX2XMLReader[0xd])
            (this->fParser,&xercesc_4_0::XMLUni::fgXercesScannerName,scanner);
  (*this->fParser->_vptr_SAX2XMLReader[0xc])
            (this->fParser,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
  (*this->fParser->_vptr_SAX2XMLReader[0xc])(this->fParser,&xercesc_4_0::XMLUni::fgXercesDynamic,0);
  pBVar2 = &this->fErrorHandler;
  (*this->fParser->_vptr_SAX2XMLReader[0xb])();
  this_00 = (XMLURL *)xercesc_4_0::XMemory::operator_new((XMemory *)0x58,(ulong)pBVar2);
  xercesc_4_0::XMLURL::XMLURL(this_00,&(this->super_BaseHarnessHandlers).fBaseURL);
  xercesc_4_0::RefStackOf<xercesc_4_0::XMLURL>::push(&this->fTestBaseURL,this_00);
  return;
}

Assistant:

XMLHarnessHandlers::XMLHarnessHandlers(const XMLCh* baseURL, const XMLCh* scanner) : BaseHarnessHandlers(baseURL)
, fTestBaseURL(5)
{
    fParser = XMLReaderFactory::createXMLReader();
    fParser->setProperty(XMLUni::fgXercesScannerName, (void*)scanner);
    fParser->setFeature(XMLUni::fgSAX2CoreValidation, true);
    fParser->setFeature(XMLUni::fgXercesDynamic, false);
    fParser->setErrorHandler(&fErrorHandler);
    
    fTestBaseURL.push(new XMLURL(fBaseURL));
}